

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O0

UINT8 device_start_ym2610(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA *devData_00;
  undefined8 *param;
  void *pvVar1;
  DEV_DEF *devDef;
  DEV_DEF *devDefPtr;
  UINT32 rate;
  DEV_DATA *devData;
  OPN_INF *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devDefPtr._4_4_ = cfg->clock / 0x90;
  if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (devDefPtr._4_4_ < cfg->smplRate)))) {
    devDefPtr._4_4_ = cfg->smplRate;
  }
  param = (undefined8 *)malloc(0x10);
  param[1] = 0;
  pvVar1 = ym2610_init(param,cfg->clock,devDefPtr._4_4_,(FM_TIMERHANDLER)0x0,(FM_IRQHANDLER)0x0);
  *param = pvVar1;
  devDef = &devDef_MAME_2610;
  if (cfg->flags != '\0') {
    devDef = &devDef_MAME_2610B;
  }
  devData_00 = (DEV_DATA *)*param;
  devData_00->chipInf = param;
  INIT_DEVINF(retDevInf,devData_00,devDefPtr._4_4_,devDef);
  init_ssg_devinfo(retDevInf,cfg,'\x02','\"');
  return '\0';
}

Assistant:

static UINT8 device_start_ym2610(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	OPN_INF* info;
	DEV_DATA* devData;
	UINT32 rate;
	const DEV_DEF* devDefPtr;
	
	rate = cfg->clock / 2 / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	info = (OPN_INF*)malloc(sizeof(OPN_INF));
	info->ssg = NULL;
	info->opn = ym2610_init(info, cfg->clock, rate, NULL, NULL);
	devDefPtr = cfg->flags ? &devDef_MAME_2610B : &devDef_MAME_2610;
	
	devData = (DEV_DATA*)info->opn;
	devData->chipInf = info;	// store pointer to OPN_INF into sound chip structure
	INIT_DEVINF(retDevInf, devData, rate, devDefPtr);
	init_ssg_devinfo(retDevInf, cfg, 2, AYTYPE_YM2610);
	return 0x00;
}